

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O1

string * __thiscall
sentencepiece::string_util::UnicodeTextToUTF8_abi_cxx11_
          (string *__return_storage_ptr__,string_util *this,UnicodeText *utext)

{
  char32 *pcVar1;
  char32 *pcVar2;
  char buf [8];
  char local_30 [8];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar2 = *(char32 **)this;
  pcVar1 = *(char32 **)(this + 8);
  if (pcVar2 != pcVar1) {
    do {
      EncodeUTF8(*pcVar2,local_30);
      std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)local_30);
      pcVar2 = pcVar2 + 1;
    } while (pcVar2 != pcVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string UnicodeTextToUTF8(const UnicodeText &utext) {
  char buf[8];
  std::string result;
  for (const char32 c : utext) {
    const size_t mblen = EncodeUTF8(c, buf);
    result.append(buf, mblen);
  }
  return result;
}